

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_object.c
# Opt level: O0

void parse_object_should_parse_objects_with_one_element(void)

{
  assert_parse_object("{\"one\":1}");
  assert_is_child(item[0].child,"one",8);
  reset(item);
  assert_parse_object("{\"hello\":\"world!\"}");
  assert_is_child(item[0].child,"hello",0x10);
  reset(item);
  assert_parse_object("{\"array\":[]}");
  assert_is_child(item[0].child,"array",0x20);
  reset(item);
  assert_parse_object("{\"null\":null}");
  assert_is_child(item[0].child,"null",4);
  reset(item);
  return;
}

Assistant:

static void parse_object_should_parse_objects_with_one_element(void)
{

    assert_parse_object("{\"one\":1}");
    assert_is_child(item->child, "one", cJSON_Number);
    reset(item);

    assert_parse_object("{\"hello\":\"world!\"}");
    assert_is_child(item->child, "hello", cJSON_String);
    reset(item);

    assert_parse_object("{\"array\":[]}");
    assert_is_child(item->child, "array", cJSON_Array);
    reset(item);

    assert_parse_object("{\"null\":null}");
    assert_is_child(item->child, "null", cJSON_NULL);
    reset(item);
}